

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O2

string * __thiscall
duckdb::StrpTimeFormat::ParseResult::FormatError
          (string *__return_storage_ptr__,ParseResult *this,string_t input,string *format_specifier)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50 [32];
  anon_union_16_2_67f50693_for_value local_30;
  
  local_30.pointer.ptr = (char *)input.value._8_8_;
  local_30._0_8_ = input.value._0_8_;
  ::std::__cxx11::string::string
            (local_50,
             "Could not parse string \"%s\" according to format specifier \"%s\"\n%s\nError: %s",
             (allocator *)&stack0xffffffffffffff0f);
  string_t::GetString_abi_cxx11_(&local_70,(string_t *)&local_30.pointer);
  ::std::__cxx11::string::string((string *)&local_90,(string *)format_specifier);
  string_t::GetString_abi_cxx11_(&local_d0,(string_t *)&local_30.pointer);
  FormatStrpTimeError(&local_b0,&local_d0,(optional_idx)(this->error_position).index);
  ::std::__cxx11::string::string((string *)&local_f0,(string *)&this->error_message);
  StringUtil::
  Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(StringUtil *)local_50,&local_70,&local_90,&local_b0,&local_f0,
             in_stack_ffffffffffffff08);
  ::std::__cxx11::string::~string((string *)&local_f0);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_d0);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

string StrpTimeFormat::ParseResult::FormatError(string_t input, const string &format_specifier) {
	return StringUtil::Format("Could not parse string \"%s\" according to format specifier \"%s\"\n%s\nError: %s",
	                          input.GetString(), format_specifier,
	                          FormatStrpTimeError(input.GetString(), error_position), error_message);
}